

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ConstExpr.cpp
# Opt level: O2

bool TestConstExpr::LessThanEqualTest<unsigned_long_long,unsigned_long>(void)

{
  int local_40 [4];
  SafeInt<unsigned_long,_safeint_exception_handlers::SafeInt_InvalidParameter> local_30;
  SafeInt<unsigned_long_long,_safeint_exception_handlers::SafeInt_InvalidParameter> local_28;
  SafeInt<unsigned_long_long,_safeint_exception_handlers::SafeInt_InvalidParameter> local_20;
  SafeInt<unsigned_long_long,_safeint_exception_handlers::SafeInt_InvalidParameter> local_18;
  
  local_40[3] = 3;
  SafeInt<unsigned_long_long,_safeint_exception_handlers::SafeInt_InvalidParameter>::SafeInt<int>
            (&local_18,local_40 + 3);
  if (1 < local_18.m_int) {
    local_40[2] = 4;
    SafeInt<unsigned_long_long,_safeint_exception_handlers::SafeInt_InvalidParameter>::SafeInt<int>
              (&local_20,local_40 + 2);
    if (local_20.m_int < 6) {
      local_40[1] = 6;
      SafeInt<unsigned_long_long,_safeint_exception_handlers::SafeInt_InvalidParameter>::
      SafeInt<int>(&local_28,local_40 + 1);
      local_40[0] = 7;
      SafeInt<unsigned_long,_safeint_exception_handlers::SafeInt_InvalidParameter>::SafeInt<int>
                (&local_30,local_40);
      return local_28.m_int <= local_30.m_int;
    }
  }
  return false;
}

Assistant:

SAFEINT_CONSTEXPR11 bool LessThanEqualTest()
	{
		return
			(U)2 <= SafeInt<T>(3) &&
			SafeInt<T>(4) <= (U)5 &&
			SafeInt<T>(6) <= SafeInt<U>(7);
	}